

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

int32_t uloc_getParent_63(char *localeID,char *parent,int32_t parentCapacity,UErrorCode *err)

{
  int32_t iVar1;
  int32_t iVar2;
  char *pcVar3;
  
  if (U_ZERO_ERROR < *err) {
    return 0;
  }
  if (localeID == (char *)0x0) {
    localeID = locale_get_default_63();
  }
  pcVar3 = strrchr(localeID,0x5f);
  iVar2 = 0;
  if (pcVar3 != (char *)0x0) {
    iVar2 = (int)pcVar3 - (int)localeID;
  }
  if (localeID != parent && 0 < iVar2) {
    iVar1 = uprv_min_63(iVar2,parentCapacity);
    memcpy(parent,localeID,(long)iVar1);
  }
  iVar2 = u_terminateChars_63(parent,parentCapacity,iVar2,err);
  return iVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }